

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<int>::Delete_Aux(BpTree<int> *this,IndexNode<int> *C,int k,Addr p)

{
  value_type vVar1;
  value_type vVar2;
  Addr p_00;
  value_type vVar3;
  value_type vVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  bool bVar10;
  bool bVar11;
  int local_868;
  int local_864;
  int k2;
  IndexNode<int> local_7e0;
  byte local_779;
  IndexNode<int> local_778;
  byte local_711;
  IndexNode<int> local_710;
  byte local_6a9;
  IndexNode<int> local_6a8;
  Addr local_648;
  byte local_639;
  IndexNode<int> local_638;
  byte local_5d1;
  IndexNode<int> local_5d0;
  byte local_569;
  IndexNode<int> local_568;
  byte local_501;
  IndexNode<int> local_500;
  Addr local_4a0;
  Addr local_498;
  undefined1 local_490 [8];
  IndexNode<int> P;
  IndexNode<int> local_3d0;
  undefined4 local_36c;
  IndexNode<int> local_368;
  IndexNode<int> local_308;
  Addr local_2a8;
  IndexNode<int> local_2a0;
  IndexNode<int> local_240;
  IndexNode<int> local_1e0;
  int local_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  IndexNode<int> local_170;
  int local_110;
  int flag;
  int n;
  int m;
  int j;
  int i;
  int pos;
  IndexNode<int> D;
  IndexNode<int> local_88;
  int local_24;
  IndexNode<int> *pIStack_20;
  int k_local;
  IndexNode<int> *C_local;
  BpTree<int> *this_local;
  Addr p_local;
  
  local_24 = k;
  pIStack_20 = C;
  C_local = (IndexNode<int> *)this;
  this_local = (BpTree<int> *)p;
  IndexNode<int>::IndexNode(&local_88,C);
  LockNode(this,&local_88);
  IndexNode<int>::~IndexNode(&local_88);
  IndexNode<int>::IndexNode((IndexNode<int> *)&i,this->N);
  local_110 = 0;
  m = 0;
  while( true ) {
    bVar10 = false;
    if (m < this->N + -1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pIStack_20->k,(long)m);
      bVar10 = *pvVar6 != local_24;
    }
    n = m;
    if (!bVar10) break;
    m = m + 1;
  }
  while (n = n + 1, n < this->N + -1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pIStack_20->k,(long)n);
    vVar2 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pIStack_20->k,(long)(n + -1));
    *pvVar6 = vVar2;
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)n);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)(n + -1));
    *pvVar7 = vVar1;
  }
  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)(this->N + -2))
  ;
  *pvVar7 = '0';
  IndexNode<int>::IndexNode(&local_170,pIStack_20);
  iVar5 = IsLeaf(this,&local_170);
  IndexNode<int>::~IndexNode(&local_170);
  if (iVar5 == 0) {
    m = 0;
    while( true ) {
      bVar10 = false;
      if (m < this->N) {
        pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)m);
        bVar10 = pvVar8->FileOff != this_local._4_4_;
      }
      iVar5 = m;
      if (!bVar10) break;
      m = m + 1;
    }
    while (n = iVar5 + 1, n < this->N) {
      pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)n);
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)(n + -1));
      *pvVar9 = *pvVar8;
      iVar5 = n;
    }
    local_180 = -1;
    iStack_17c = -1;
    pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       (&pIStack_20->p,(long)(this->N + -1));
    vVar3.FileOff = iStack_17c;
    vVar3.BlockNum = local_180;
    *pvVar8 = vVar3;
  }
  else {
    m = 0;
    while( true ) {
      bVar10 = false;
      if (m < this->N + -1) {
        pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)m);
        bVar10 = pvVar8->FileOff != this_local._4_4_;
      }
      iVar5 = m;
      if (!bVar10) break;
      m = m + 1;
    }
    while (n = iVar5 + 1, n < this->N + -1) {
      pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)n);
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)(n + -1));
      *pvVar9 = *pvVar8;
      iVar5 = n;
    }
    local_178 = -1;
    iStack_174 = -1;
    pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       (&pIStack_20->p,(long)(this->N + -2));
    vVar4.FileOff = iStack_174;
    vVar4.BlockNum = local_178;
    *pvVar8 = vVar4;
  }
  IndexNode<int>::IndexNode(&local_1e0,pIStack_20);
  iVar5 = IsRoot(this,&local_1e0);
  IndexNode<int>::~IndexNode(&local_1e0);
  if (iVar5 != 0) {
    IndexNode<int>::IndexNode(&local_240,pIStack_20);
    iVar5 = IsLeaf(this,&local_240);
    IndexNode<int>::~IndexNode(&local_240);
    if (iVar5 == 0) {
      pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,1);
      if (pvVar8->FileOff == -1) {
        pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,0);
        local_2a8.BlockNum = pvVar8->BlockNum;
        local_2a8.FileOff = pvVar8->FileOff;
        FindNode(this,local_2a8,(IndexNode<int> *)&i);
        D.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)&pIStack_20->parent;
        IndexNode<int>::IndexNode(&local_308,(IndexNode<int> *)&i);
        UpdateBlock(this,&local_308);
        IndexNode<int>::~IndexNode(&local_308);
        pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,0);
        iVar5 = pvVar8->FileOff;
        (this->RootAddr).BlockNum = pvVar8->BlockNum;
        (this->RootAddr).FileOff = iVar5;
        DeleteNode(this,pIStack_20);
      }
      else {
        IndexNode<int>::IndexNode(&local_368,pIStack_20);
        UpdateBlock(this,&local_368);
        IndexNode<int>::~IndexNode(&local_368);
      }
    }
    else {
      pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,0);
      if (*pvVar7 == '0') {
        pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,0);
        iVar5 = pvVar8->FileOff;
        (this->RootAddr).BlockNum = pvVar8->BlockNum;
        (this->RootAddr).FileOff = iVar5;
        DeleteNode(this,pIStack_20);
      }
      else {
        IndexNode<int>::IndexNode(&local_2a0,pIStack_20);
        UpdateBlock(this,&local_2a0);
        IndexNode<int>::~IndexNode(&local_2a0);
      }
    }
    local_36c = 1;
    goto LAB_00183d8c;
  }
  IndexNode<int>::IndexNode(&local_3d0,pIStack_20);
  iVar5 = IsFew(this,&local_3d0);
  IndexNode<int>::~IndexNode(&local_3d0);
  if (iVar5 == 0) {
    IndexNode<int>::IndexNode((IndexNode<int> *)&P.self,pIStack_20);
    UpdateBlock(this,(IndexNode<int> *)&P.self);
    IndexNode<int>::~IndexNode((IndexNode<int> *)&P.self);
    local_36c = 1;
    goto LAB_00183d8c;
  }
  n = -1;
  IndexNode<int>::IndexNode((IndexNode<int> *)local_490,this->N);
  local_498 = pIStack_20->parent;
  FindNode(this,local_498,(IndexNode<int> *)local_490);
  m = 0;
  while( true ) {
    bVar10 = false;
    if (m < this->N) {
      pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)m);
      bVar10 = pvVar8->FileOff != (pIStack_20->self).FileOff;
    }
    if (!bVar10) break;
    m = m + 1;
  }
  if ((m + 1 < this->N) &&
     (pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)(m + 1)), pvVar8->FileOff != -1)) {
    pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)
                        &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                        (long)(m + 1));
    local_4a0.BlockNum = pvVar8->BlockNum;
    local_4a0.FileOff = pvVar8->FileOff;
    FindNode(this,local_4a0,(IndexNode<int> *)&i);
    local_501 = 0;
    local_569 = 0;
    local_5d1 = 0;
    local_639 = 0;
    if (m == 0) {
      IndexNode<int>::IndexNode(&local_500,pIStack_20);
      local_501 = 1;
      IndexNode<int>::IndexNode(&local_568,(IndexNode<int> *)&i);
      local_569 = 1;
      iVar5 = CanFit(this,&local_500,&local_568);
      bVar10 = true;
      if (iVar5 == 0) goto LAB_00183701;
    }
    else {
LAB_00183701:
      bVar10 = false;
      if (m + 1 < this->N) {
        pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(m + 1));
        bVar10 = false;
        if (pvVar8->FileOff != -1) {
          IndexNode<int>::IndexNode(&local_5d0,pIStack_20);
          local_5d1 = 1;
          IndexNode<int>::IndexNode(&local_638,(IndexNode<int> *)&i);
          local_639 = 1;
          iVar5 = CanFit(this,&local_5d0,&local_638);
          bVar10 = iVar5 != 0;
        }
      }
    }
    if ((local_639 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_638);
    }
    if ((local_5d1 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_5d0);
    }
    if ((local_569 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_568);
    }
    if ((local_501 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_500);
    }
    if (bVar10) {
      n = m + 1;
      local_110 = 1;
    }
  }
  if (0 < m) {
    pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)
                        &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                        (long)(m + -1));
    local_648.BlockNum = pvVar8->BlockNum;
    local_648.FileOff = pvVar8->FileOff;
    FindNode(this,local_648,(IndexNode<int> *)&i);
    local_6a9 = 0;
    local_711 = 0;
    local_779 = 0;
    bVar10 = false;
    if ((m + 1 == this->N) ||
       (pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(m + 1)), pvVar8->FileOff == -1)) {
      IndexNode<int>::IndexNode(&local_6a8,pIStack_20);
      local_6a9 = 1;
      IndexNode<int>::IndexNode(&local_710,(IndexNode<int> *)&i);
      local_711 = 1;
      iVar5 = CanFit(this,&local_6a8,&local_710);
      bVar11 = true;
      if (iVar5 == 0) goto LAB_00183a20;
    }
    else {
LAB_00183a20:
      bVar11 = false;
      bVar10 = 0 < m;
      if (bVar10) {
        IndexNode<int>::IndexNode(&local_778,pIStack_20);
        local_779 = 1;
        IndexNode<int>::IndexNode(&local_7e0,(IndexNode<int> *)&i);
        iVar5 = CanFit(this,&local_778,&local_7e0);
        bVar11 = iVar5 != 0;
      }
    }
    if (bVar10) {
      IndexNode<int>::~IndexNode(&local_7e0);
    }
    if ((local_779 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_778);
    }
    if ((local_711 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_710);
    }
    if ((local_6a9 & 1) != 0) {
      IndexNode<int>::~IndexNode(&local_6a8);
    }
    if (bVar11) {
      n = m + -1;
      local_110 = 1;
    }
  }
  if (local_110 == 0) {
    if (m == 0) {
      local_864 = 1;
    }
    else {
      local_864 = m + -1;
    }
    n = local_864;
  }
  pvVar8 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                     ((vector<Addr,_std::allocator<Addr>_> *)
                      &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                      (long)n);
  p_00.BlockNum = pvVar8->BlockNum;
  p_00.FileOff = pvVar8->FileOff;
  FindNode(this,p_00,(IndexNode<int> *)&i);
  if (m < n) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&P,(long)m);
    local_868 = *pvVar6;
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&P,(long)n);
    local_868 = *pvVar6;
  }
  if (local_110 == 0) {
    Redistribute(this,pIStack_20,(IndexNode<int> *)&i,local_868,m,n);
  }
  else if (n == m + 1) {
    Coalesce(this,(IndexNode<int> *)&i,pIStack_20,local_868);
  }
  else if (n == m + -1) {
    Coalesce(this,pIStack_20,(IndexNode<int> *)&i,local_868);
  }
  local_36c = 1;
  IndexNode<int>::~IndexNode((IndexNode<int> *)local_490);
LAB_00183d8c:
  IndexNode<int>::~IndexNode((IndexNode<int> *)&i);
  return;
}

Assistant:

void BpTree<K>::Delete_Aux(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	IndexNode<K> D(N);
	int pos, i, j, m, n, flag = 0;
	for (i = 0; i < N - 1 && C.k[i] != k; i++);
	for (j = i + 1; j < N - 1; j++) {
		C.k[j - 1] = C.k[j];
		C.v[j - 1] = C.v[j];
	}
	C.v[N - 2] = '0';										//ɾ��k
	if (this->IsLeaf(C)) {
		for (i = 0; i < N - 1 && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N - 1; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 2] = { -1, -1 };
	}
	else {
		for (i = 0; i < N && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 1] = { -1, -1 };
	}														//ɾ��p
	if (this->IsRoot(C)) {
		if (this->IsLeaf(C)) {								//������ֻʣһ�����
			if (C.v[0] == '0') {							//��û�м�ֵ
				this->RootAddr = C.p[0];					//�����
				this->DeleteNode(C);
			}
			else {
				//���м�ֵ������
				this->UpdateBlock(C);
			}
		}
		else {												//�����к���
			if (C.p[1].FileOff == -1) {						//��ֻ��һ������
				this->FindNode(C.p[0], D);
				D.parent = C.parent;
				this->UpdateBlock(D);
				this->RootAddr = C.p[0];
				this->DeleteNode(C);						//��ת�������ĺ���
			}
			else {
				//������и��ຢ�ӣ�����
				this->UpdateBlock(C);
			}
		}
		return;
	}
	//�Ǹ����
	if (!this->IsFew(C)) {
		this->UpdateBlock(C);
		return;
	}
	//ָ�������ֵ��̫�٣����Ǻϲ����߷�̯
	j = -1;
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	for (i = 0; i < N && P.p[i].FileOff != C.self.FileOff; i++);	//P.p[i] == C.self
	if (i+1 < N && P.p[i + 1].FileOff != -1) {
		this->FindNode(P.p[i + 1], D);
		if ((i == 0 && CanFit(C, D) ||
			(i + 1 < N && P.p[i + 1].FileOff != -1 && CanFit(C, D)))) {
			j = i + 1;		//��������֮�ɺϲ�����D = P_i+1
			flag = 1;
		}
	}
	if (i > 0) {
		this->FindNode(P.p[i - 1], D);
		if (((i + 1 == N || P.p[i + 1].FileOff == -1) && CanFit(C, D)) ||
			(i > 0 && CanFit(C, D))) {
			j = i - 1;		//��������֮�ɺϲ�����D = P_i-1
			flag = 1;
		}
	}
	//�������ڽԿɺϲ�ʱ������ѡD = P_i-1
	if (!flag) {
		j = (i == 0) ? 1 : i - 1;
		//���Ҳ����ɺϲ����ھӣ�����ѡ���ھ�
	}
	this->FindNode(P.p[j], D);
	K k2 = (i < j) ? P.k[i] : P.k[j];
	if (flag) {
		//�ϲ�����
		if (j == i + 1) {
			this->Coalesce(D, C, k2);
		}
		else if(j == i-1) {
			this->Coalesce(C, D, k2);
		}
	}
	else {
		//��̯����
		this->Redistribute(C, D, k2, i, j);
	}
	return;
}